

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall yy::parser::yy_stack_print_(parser *this)

{
  pointer psVar1;
  ostream *this_00;
  pointer psVar2;
  
  std::operator<<(this->yycdebug_,"Stack now");
  psVar1 = (this->yystack_).seq_.
           super__Vector_base<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (this->yystack_).seq_.
                super__Vector_base<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    this_00 = std::operator<<(this->yycdebug_,' ');
    std::ostream::operator<<
              ((ostream *)this_00,
               (int)(psVar2->super_basic_symbol<yy::parser::by_state>).super_by_state.state);
  }
  std::operator<<(this->yycdebug_,'\n');
  return;
}

Assistant:

void
  parser::yy_stack_print_ () const
  {
    *yycdebug_ << "Stack now";
    for (stack_type::const_iterator
           i = yystack_.begin (),
           i_end = yystack_.end ();
         i != i_end; ++i)
      *yycdebug_ << ' ' << int (i->state);
    *yycdebug_ << '\n';
  }